

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

void __thiscall CVmObjFile::switch_read_write_mode(CVmObjFile *this,int writing)

{
  vmobjfile_ext_t *pvVar1;
  long lVar2;
  int in_ESI;
  CVmObjFile *in_RDI;
  bool bVar3;
  int was_writing;
  CVmObjFile *this_00;
  
  if ((in_ESI != 0) && (pvVar1 = get_ext(in_RDI), pvVar1->readbuf != (vmobjfile_readbuf_t *)0x0)) {
    pvVar1 = get_ext(in_RDI);
    pvVar1->readbuf->rem = 0;
  }
  pvVar1 = get_ext(in_RDI);
  if ((pvVar1->flags & 2) != 0) {
    pvVar1 = get_ext(in_RDI);
    bVar3 = (pvVar1->flags & 4) != 0;
    if (((in_ESI != 0) && (!bVar3)) || ((in_ESI == 0 && (bVar3)))) {
      pvVar1 = get_ext(in_RDI);
      this_00 = (CVmObjFile *)pvVar1->fp;
      lVar2 = get_pos(this_00);
      (*(this_00->super_CVmObject)._vptr_CVmObject[8])(this_00,lVar2,0);
    }
  }
  pvVar1 = get_ext(in_RDI);
  pvVar1->flags = pvVar1->flags | 2;
  if (in_ESI == 0) {
    pvVar1 = get_ext(in_RDI);
    pvVar1->flags = pvVar1->flags & 0xfffffffffffffffb;
  }
  else {
    pvVar1 = get_ext(in_RDI);
    pvVar1->flags = pvVar1->flags | 4;
  }
  return;
}

Assistant:

void CVmObjFile::switch_read_write_mode(VMG_ int writing)
{
    /* if we're writing, invalidate the read buffer */
    if (writing && get_ext()->readbuf != 0)
        get_ext()->readbuf->rem = 0;

    /* 
     *   if we just performed a read or write operation, we must seek if
     *   we're performing the opposite type of operation now 
     */
    if ((get_ext()->flags & VMOBJFILE_STDIO_BUF_DIRTY) != 0)
    {
        int was_writing;

        /* check what type of operation we did last */
        was_writing = ((get_ext()->flags & VMOBJFILE_LAST_OP_WRITE) != 0);

        /* 
         *   if we're switching operations, explicitly seek to the current
         *   location to flush the stdio buffers 
         */
        if ((writing && !was_writing) || (!writing && was_writing))
            get_ext()->fp->seek(get_pos(vmg0_), OSFSK_SET);
    }

    /* 
     *   remember that this operation is stdio-buffered, so that we'll know
     *   we need to seek if we perform the opposite operation after this one 
     */
    get_ext()->flags |= VMOBJFILE_STDIO_BUF_DIRTY;

    /* remember which type of operation we're performing */
    if (writing)
        get_ext()->flags |= VMOBJFILE_LAST_OP_WRITE;
    else
        get_ext()->flags &= ~VMOBJFILE_LAST_OP_WRITE;
}